

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByName(DescriptorPool *this,string *name)

{
  Tables *this_00;
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  Symbol SVar2;
  
  this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                      (&this->tables_);
  SVar2 = Tables::FindByNameHelper(this_00,this,name);
  aVar1 = SVar2.field_1;
  if ((SVar2.type != FIELD) ||
     (*(FieldDescriptor *)(aVar1.descriptor + 0x50) == (FieldDescriptor)0x0)) {
    aVar1.descriptor = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)aVar1.descriptor;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByName(
    const string& name) const {
  Symbol result = tables_->FindByNameHelper(this, name);
  if (result.type == Symbol::FIELD &&
      result.field_descriptor->is_extension()) {
    return result.field_descriptor;
  } else {
    return NULL;
  }
}